

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_1a3010::ClearLoadStoreInfo
               (VmModule *module,VariableData *container,uint storeOffset,uint storeSize)

{
  bool bVar1;
  uint uVar2;
  LoadStoreInfo *pLVar3;
  LoadStoreInfo *pLVar4;
  uint otherSize_1;
  uint otherOffset_1;
  uint otherSize;
  uint otherOffset;
  LoadStoreInfo *el;
  uint i;
  uint storeSize_local;
  uint storeOffset_local;
  VariableData *container_local;
  VmModule *module_local;
  
  if (storeSize == 0) {
    __assert_fail("storeSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x565,
                  "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                 );
  }
  el._4_4_ = 0;
LAB_0035f384:
  while( true ) {
    uVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo);
    if (uVar2 <= el._4_4_) {
      return;
    }
    pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_);
    if (pLVar3->loadAddress == (VmConstant *)0x0) break;
    uVar2 = pLVar3->loadAddress->iValue;
    if (pLVar3->accessSize == 0) {
      __assert_fail("otherSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x571,
                    "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                   );
    }
    if (((container != pLVar3->loadAddress->container) || ((storeOffset + storeSize) - 1 < uVar2))
       || ((uVar2 + pLVar3->accessSize) - 1 < storeOffset)) break;
    pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
    pLVar4 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_);
    memcpy(pLVar4,pLVar3,0x52);
    SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
  }
  if (pLVar3->storeAddress != (VmConstant *)0x0) {
    uVar2 = pLVar3->storeAddress->iValue;
    if (pLVar3->accessSize == 0) {
      __assert_fail("otherSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x582,
                    "void (anonymous namespace)::ClearLoadStoreInfo(VmModule *, VariableData *, unsigned int, unsigned int)"
                   );
    }
    if (((container == pLVar3->storeAddress->container) && (uVar2 <= (storeOffset + storeSize) - 1))
       && (storeOffset <= (uVar2 + pLVar3->accessSize) - 1)) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
      pLVar4 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_)
      ;
      memcpy(pLVar4,pLVar3,0x52);
      SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
      goto LAB_0035f384;
    }
  }
  if ((pLVar3->loadPointer == (VmValue *)0x0) && (pLVar3->storePointer == (VmValue *)0x0)) {
    el._4_4_ = el._4_4_ + 1;
  }
  else {
    bVar1 = HasAddressTaken(container);
    if (bVar1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
      pLVar4 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_)
      ;
      memcpy(pLVar4,pLVar3,0x52);
      SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
    }
    else {
      el._4_4_ = el._4_4_ + 1;
    }
  }
  goto LAB_0035f384;
}

Assistant:

void ClearLoadStoreInfo(VmModule *module, VariableData *container, unsigned storeOffset, unsigned storeSize)
	{
		assert(storeSize != 0);

		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			// Check load region intersection
			if(el.loadAddress)
			{
				unsigned otherOffset = unsigned(el.loadAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.loadAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Check store region intersection
			if(el.storeAddress)
			{
				unsigned otherOffset = unsigned(el.storeAddress->iValue);
				unsigned otherSize = el.accessSize;

				assert(otherSize != 0);

				// (a+aw >= b) && (a <= b+bw)
				if(container == el.storeAddress->container && storeOffset + storeSize - 1 >= otherOffset && storeOffset <= otherOffset + otherSize - 1)
				{
					module->loadStoreInfo[i] = module->loadStoreInfo.back();
					module->loadStoreInfo.pop_back();
					continue;
				}
			}

			// Any opaque pointer might be clobbered
			if(el.loadPointer || el.storePointer)
			{
				// Unless it's impossible to have an opaque pointer to this container
				if(!HasAddressTaken(container))
				{
					i++;
					continue;
				}

				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
				continue;
			}

			i++;
		}
	}